

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall
cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>::duplicate
          (holder<std::pair<cs_impl::any,_cs_impl::any>_> *this)

{
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *phVar1;
  pair<cs_impl::any,_cs_impl::any> *in_stack_00000008;
  allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::pair<cs_impl::any,cs_impl::any>&>(in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}